

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTupleTo<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>,2ul>
               (tuple<int,_const_pstore::gsl::span<unsigned_char,__1L>_&> *t,ostream *param_2)

{
  span<unsigned_char,__1L> *value;
  ostream *os_local;
  tuple<int,_const_pstore::gsl::span<unsigned_char,__1L>_&> *t_local;
  
  PrintTupleTo<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>,1ul>(t,param_2);
  std::operator<<(param_2,", ");
  value = std::get<1ul,int,pstore::gsl::span<unsigned_char,_1l>const&>(t);
  UniversalPrinter<const_pstore::gsl::span<unsigned_char,_-1L>_&>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}